

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

MTBDD mtbdd_cube(MTBDD variables,uint8_t *cube,MTBDD terminal)

{
  long *plVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  uint uVar4;
  MTBDD MVar5;
  MTBDD MVar6;
  uint8_t *cube_00;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  
  cube_00 = cube + 1;
LAB_0010c49d:
  if (variables != 0x8000000000000000) {
    if (cube_00[-1] < 4) {
      puVar2 = nodes->data;
      lVar8 = (variables & 0xffffffffff) * 0x10;
      switch(cube_00[-1]) {
      case '\0':
        MVar6 = mtbdd_cube(variables & 0x8000000000000000 ^
                           *(ulong *)(puVar2 + lVar8) & 0x800000ffffffffff,cube_00,terminal);
        MVar5 = 0;
        uVar4 = (uint)((ulong)*(undefined8 *)(puVar2 + lVar8 + 8) >> 0x20);
        break;
      case '\x01':
        MVar5 = mtbdd_cube(variables & 0x8000000000000000 ^
                           *(ulong *)(puVar2 + lVar8) & 0x800000ffffffffff,cube_00,terminal);
        uVar4 = (uint)((ulong)*(undefined8 *)(puVar2 + lVar8 + 8) >> 0x20);
        MVar6 = 0;
        break;
      case '\x02':
        goto switchD_0010c4ca_caseD_2;
      case '\x03':
        lVar7 = (*(ulong *)(puVar2 + lVar8) & 0xffffffffff) * 0x10;
        uVar3 = *(undefined8 *)(puVar2 + lVar7 + 8);
        MVar5 = mtbdd_cube((variables ^ *(ulong *)(puVar2 + lVar8)) & 0x8000000000000000 ^
                           *(ulong *)(puVar2 + lVar7) & 0x800000ffffffffff,cube_00 + 1,terminal);
        uVar4 = (uint)((ulong)uVar3 >> 0x20);
        MVar6 = mtbdd_makenode(uVar4 >> 8,MVar5,0);
        mtbdd_refs_push(MVar6);
        MVar5 = mtbdd_makenode(uVar4 >> 8,0,MVar5);
        plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x28);
        *plVar1 = *plVar1 + -8;
        uVar4 = (uint)((ulong)*(undefined8 *)(puVar2 + lVar8 + 8) >> 0x20);
      }
      MVar6 = mtbdd_makenode(uVar4 >> 8,MVar6,MVar5);
      return MVar6;
    }
    terminal = 0;
  }
  return terminal;
switchD_0010c4ca_caseD_2:
  cube_00 = cube_00 + 1;
  variables = variables & 0x8000000000000000 ^ *(ulong *)(puVar2 + lVar8) & 0x800000ffffffffff;
  goto LAB_0010c49d;
}

Assistant:

MTBDD
mtbdd_cube(MTBDD variables, uint8_t *cube, MTBDD terminal)
{
    if (variables == mtbdd_true) return terminal;
    mtbddnode_t n = MTBDD_GETNODE(variables);

    BDD result;
    switch (*cube) {
    case 0:
        result = mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
        result = mtbdd_makenode(mtbddnode_getvariable(n), result, mtbdd_false);
        return result;
    case 1:
        result = mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
        result = mtbdd_makenode(mtbddnode_getvariable(n), mtbdd_false, result);
        return result;
    case 2:
        return mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
    case 3:
    {
        MTBDD variables2 = node_gethigh(variables, n);
        mtbddnode_t n2 = MTBDD_GETNODE(variables2);
        uint32_t var2 = mtbddnode_getvariable(n2);
        result = mtbdd_cube(node_gethigh(variables2, n2), cube+2, terminal);
        BDD low = mtbdd_makenode(var2, result, mtbdd_false);
        mtbdd_refs_push(low);
        BDD high = mtbdd_makenode(var2, mtbdd_false, result);
        mtbdd_refs_pop(1);
        result = mtbdd_makenode(mtbddnode_getvariable(n), low, high);
        return result;
    }
    default:
        return mtbdd_false; // ?
    }
}